

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::ExtensionSet::FindExtensionInfoFromFieldNumber
          (ExtensionSet *this,int wire_type,int field_number,ExtensionFinder *extension_finder,
          ExtensionInfo *extension,bool *was_packed_on_wire)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  LogMessage *pLVar4;
  bool bVar5;
  LogFinisher local_69;
  LogMessage local_68;
  
  iVar3 = (*extension_finder->_vptr_ExtensionFinder[2])
                    (extension_finder,(ulong)(uint)field_number,extension);
  if ((char)iVar3 == '\0') {
    bVar5 = false;
  }
  else {
    bVar1 = extension->type;
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3f);
      pLVar4 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_69,pLVar4);
      LogMessage::~LogMessage(&local_68);
    }
    uVar2 = *(uint *)(WireFormatLite::kWireTypeForFieldType + (ulong)bVar1 * 4);
    *was_packed_on_wire = false;
    if ((wire_type == 2) && (extension->is_repeated != false)) {
      if (uVar2 < 6) {
        if ((0x1cU >> (uVar2 & 0x1f) & 1) == 0) {
          *was_packed_on_wire = true;
          return true;
        }
      }
      else {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                   ,0x55);
        pLVar4 = LogMessage::operator<<(&local_68,"can\'t reach here.");
        LogFinisher::operator=(&local_69,pLVar4);
        LogMessage::~LogMessage(&local_68);
      }
    }
    bVar5 = uVar2 == wire_type;
  }
  return bVar5;
}

Assistant:

bool ExtensionSet::FindExtensionInfoFromFieldNumber(
    int wire_type, int field_number, ExtensionFinder* extension_finder,
    ExtensionInfo* extension, bool* was_packed_on_wire) const {
  if (!extension_finder->Find(field_number, extension)) {
    return false;
  }

  WireFormatLite::WireType expected_wire_type =
      WireFormatLite::WireTypeForFieldType(real_type(extension->type));

  // Check if this is a packed field.
  *was_packed_on_wire = false;
  if (extension->is_repeated &&
      wire_type == WireFormatLite::WIRETYPE_LENGTH_DELIMITED &&
      is_packable(expected_wire_type)) {
    *was_packed_on_wire = true;
    return true;
  }
  // Otherwise the wire type must match.
  return expected_wire_type == wire_type;
}